

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O3

Object * __thiscall LiteScript::Object::Reassign(Object *this,Type *type,uint size)

{
  bool bVar1;
  void *pvVar2;
  
  bVar1 = Type::operator!=(this->type,(Type *)_type_nil);
  if (bVar1) {
    (*this->type->_vptr_Type[2])(this->type,this);
    if (this->size != 0) {
      this->size = 0;
      operator_delete(this->data);
      this->data = (void *)0x0;
    }
  }
  this->size = size;
  this->type = type;
  if (size != 0) {
    pvVar2 = operator_new((ulong)size);
    this->data = pvVar2;
  }
  return this;
}

Assistant:

LiteScript::Object& LiteScript::Object::Reassign(Type& type, unsigned int size) {
    if (*this->type != Type::NIL) {
        this->type->ODestroy(*this);
        if (this->size > 0) {
            this->size = 0;
            allocator.deallocate((char *) this->data, this->size);
            this->data = nullptr;
        }
    }
    this->size = size;
    this->type = &type;
    if (size > 0)
        this->data = allocator.allocate(size);
    return *this;
}